

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringWriter.cpp
# Opt level: O0

void __thiscall
ApprovalTests::StringWriter::StringWriter
          (StringWriter *this,string *contents,string *fileExtensionWithDot)

{
  string *in_RDX;
  string *in_RSI;
  ApprovalWriter *in_RDI;
  
  ApprovalWriter::ApprovalWriter(in_RDI);
  in_RDI->_vptr_ApprovalWriter = (_func_int **)&PTR__StringWriter_001d0670;
  ::std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  ::std::__cxx11::string::string((string *)(in_RDI + 5),in_RDX);
  return;
}

Assistant:

StringWriter::StringWriter(std::string contents, std::string fileExtensionWithDot)
        : s(std::move(contents)), ext(std::move(fileExtensionWithDot))
    {
    }